

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OptimizeInstructions.cpp
# Opt level: O2

bool __thiscall
wasm::OptimizeInstructions::shouldCanonicalize(OptimizeInstructions *this,Binary *binary)

{
  Id IVar1;
  bool bVar2;
  bool bVar3;
  uint uVar4;
  
  if ((((binary->op != SubInt64) && (binary->op != SubInt32)) || (binary->right->_id != ConstId)) ||
     (bVar3 = true, binary->left->_id == ConstId)) {
    bVar2 = Properties::isSymmetric(binary);
    bVar3 = true;
    if (!bVar2) {
      bVar2 = Binary::isRelational(binary);
      if (!bVar2) {
        uVar4 = binary->op - AddFloat32;
        bVar3 = false;
        if (uVar4 < 0x10) {
          if ((0xa005U >> (uVar4 & 0x1f) & 1) == 0) {
            bVar3 = false;
            if ((0x4002U >> (uVar4 & 0x1f) & 1) != 0) {
              bVar3 = binary->right->_id == ConstId;
            }
          }
          else {
            IVar1 = binary->left->_id;
            if (IVar1 == ConstId) {
              bVar3 = Literal::isNaN((Literal *)(binary->left + 1));
              uVar4 = (uint)!bVar3;
            }
            bVar3 = (bool)(IVar1 == ConstId & (byte)uVar4);
          }
        }
      }
    }
  }
  return bVar3;
}

Assistant:

bool shouldCanonicalize(Binary* binary) {
    if ((binary->op == SubInt32 || binary->op == SubInt64) &&
        binary->right->is<Const>() && !binary->left->is<Const>()) {
      return true;
    }
    if (Properties::isSymmetric(binary) || binary->isRelational()) {
      return true;
    }
    switch (binary->op) {
      case SubFloat32:
      case SubFloat64: {
        // Should apply  x - C  ->  x + (-C)
        return binary->right->is<Const>();
      }
      case AddFloat32:
      case MulFloat32:
      case AddFloat64:
      case MulFloat64: {
        // If the LHS is known to be non-NaN, the operands can commute.
        // We don't care about the RHS because right now we only know if
        // an expression is non-NaN if it is constant, but if the RHS is
        // constant, then this expression is already canonicalized.
        if (auto* c = binary->left->dynCast<Const>()) {
          return !c->value.isNaN();
        }
        return false;
      }
      default:
        return false;
    }
  }